

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_api.c
# Opt level: O1

char * ecs_os_api_module_to_dl(char *module)

{
  char *pcVar1;
  ecs_strbuf_t lib;
  ecs_strbuf_t local_450;
  
  memset(&local_450,0,0x440);
  pcVar1 = module_file_base(module,'_');
  ecs_strbuf_appendstr(&local_450,"lib");
  ecs_strbuf_appendstr(&local_450,pcVar1);
  ecs_strbuf_appendstr(&local_450,".so");
  (*ecs_os_api.free_)(pcVar1);
  pcVar1 = ecs_strbuf_get(&local_450);
  return pcVar1;
}

Assistant:

static
char* ecs_os_api_module_to_dl(const char *module) {
    ecs_strbuf_t lib = ECS_STRBUF_INIT;

    /* Best guess, use module name with underscores + OS library extension */
    char *file_base = module_file_base(module, '_');

#if defined(ECS_OS_LINUX)
    ecs_strbuf_appendstr(&lib, "lib");
    ecs_strbuf_appendstr(&lib, file_base);
    ecs_strbuf_appendstr(&lib, ".so");
#elif defined(ECS_OS_DARWIN)
    ecs_strbuf_appendstr(&lib, "lib");
    ecs_strbuf_appendstr(&lib, file_base);
    ecs_strbuf_appendstr(&lib, ".dylib");
#elif defined(ECS_OS_WINDOWS)
    ecs_strbuf_appendstr(&lib, file_base);
    ecs_strbuf_appendstr(&lib, ".dll");
#endif

    ecs_os_free(file_base);

    return ecs_strbuf_get(&lib);
}